

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

void __thiscall slang::JsonWriter::startObject(JsonWriter *this)

{
  pointer pFVar1;
  size_t sVar2;
  basic_string_view<char> local_58;
  string_view local_48;
  JsonWriter *local_38;
  JsonWriter *this_local;
  basic_string_view<char> *local_28;
  char *local_20;
  basic_string_view<char> *local_18;
  JsonWriter *local_10;
  
  local_38 = this;
  pFVar1 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->(&this->buffer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"{");
  FormatBuffer::append(pFVar1,local_48);
  if ((this->pretty & 1U) != 0) {
    this->currentIndent = this->indentSize + this->currentIndent;
    pFVar1 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    local_28 = &local_58;
    this_local = (JsonWriter *)anon_var_dwarf_ac34ed;
    local_20 = "\n{:{}}";
    local_18 = local_28;
    sVar2 = std::char_traits<char>::length("\n{:{}}");
    local_58.size_ = sVar2;
    local_10 = this_local;
    FormatBuffer::format<char_const(&)[1],int&>
              (pFVar1,(format_string<const_char_(&)[1],_int_&>)local_58,(char (*) [1])0x6e02a2,
               &this->currentIndent);
  }
  return;
}

Assistant:

void JsonWriter::startObject() {
    buffer->append("{");
    if (pretty) {
        currentIndent += indentSize;
        buffer->format("\n{:{}}", "", currentIndent);
    }
}